

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void pg::freeze_thaw_reset_rec_SYNC(WorkerP *w,Task *__dq_head)

{
  TD_freeze_thaw_reset_rec *t;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  if ((w->_public->movesplit == '\0') && (w->split <= __dq_head)) {
    std::atomic_store_explicit<_Worker*>
              (&__dq_head->thief,(__atomic_val_t<_Worker_*>)0x0,memory_order_relaxed);
    freeze_thaw_reset_rec_CALL
              (w,__dq_head,*(FPISolver **)__dq_head->d,*(int *)(__dq_head->d + 8),
               *(int *)(__dq_head->d + 0xc),*(int *)(__dq_head->d + 0x10));
  }
  else {
    freeze_thaw_reset_rec_SYNC_SLOW(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}